

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

bool __thiscall spvtools::opt::Instruction::IsValidBaseImage(Instruction *this)

{
  IRContext *this_00;
  uint32_t id;
  Instruction *pIVar1;
  bool bVar2;
  
  id = 0;
  if (this->has_type_id_ == true) {
    id = GetSingleWordOperand(this,0);
  }
  if (id == 0) {
    bVar2 = false;
  }
  else {
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    pIVar1 = analysis::DefUseManager::GetDef
                       ((this_00->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,id);
    bVar2 = (pIVar1->opcode_ & ~OpSourceContinued) == OpTypeImage;
  }
  return bVar2;
}

Assistant:

bool Instruction::IsValidBaseImage() const {
  uint32_t tid = type_id();
  if (tid == 0) {
    return false;
  }

  Instruction* type = context()->get_def_use_mgr()->GetDef(tid);
  return (type->opcode() == spv::Op::OpTypeImage ||
          type->opcode() == spv::Op::OpTypeSampledImage);
}